

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Type __thiscall wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Nullability NVar2;
  HeapType HVar3;
  Type type_local;
  Type local_28;
  
  HVar3.id = wasm::Type::getHeapType();
  HVar3 = getSuperType(this,HVar3);
  NVar2 = wasm::Type::getNullability();
  NVar2 = getSuperType(this,NVar2);
  wasm::Type::Type(&local_28,HVar3,NVar2);
  bVar1 = isUninhabitable(local_28);
  if (bVar1) {
    wasm::Type::Type(&type_local,HVar3,Nullable);
    local_28 = type_local;
  }
  return (Type)local_28.id;
}

Assistant:

Type TranslateToFuzzReader::getSuperType(Type type) {
  auto heapType = getSuperType(type.getHeapType());
  auto nullability = getSuperType(type.getNullability());
  auto superType = Type(heapType, nullability);
  // As with getSubType, we want to avoid returning an uninhabitable type where
  // possible. Here all we can do is flip the super's nullability to nullable.
  if (isUninhabitable(superType)) {
    superType = Type(heapType, Nullable);
  }
  return superType;
}